

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O1

void anon_unknown.dwarf_92da1::dump_header_class
               (MetaClass *top,ofstream *file,string *exportExpression)

{
  pointer psVar1;
  element_type *peVar2;
  char cVar3;
  QTextStream *pQVar4;
  MetaClass *pMVar5;
  MetaClass *pMVar6;
  ostream *poVar7;
  long *plVar8;
  long lVar9;
  char *pcVar10;
  pointer psVar11;
  shared_ptr<MetaClass> *child_1;
  shared_ptr<MetaClass> *child;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QTextStream *local_80;
  string local_78;
  string local_58;
  MetaClass *local_38;
  
  dumpQSettingsHeader();
  if ((dumpQSettingsHeader()::category[0x10] & 1) != 0) {
    dumpQSettingsHeader();
    local_78._M_dataplus._M_p._0_4_ = 2;
    local_78._M_dataplus._M_p._4_4_ = 0;
    local_78._M_string_length._0_4_ = 0;
    local_78._M_string_length._4_4_ = 0;
    local_78.field_2._M_allocated_capacity._0_4_ = 0;
    local_78.field_2._M_allocated_capacity._4_4_ = 0;
    local_78.field_2._8_8_ = dumpQSettingsHeader()::category._8_8_;
    QMessageLogger::debug();
    pQVar4 = local_80;
    QVar12.m_data = (storage_type *)0x14;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(pQVar4,(QString *)&local_58);
    if ((QArrayData *)local_58._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58._M_dataplus._M_p = *(int *)local_58._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_58._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_58._M_dataplus._M_p,2,8);
      }
    }
    if (local_80[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_80,' ');
    }
    QDebug::~QDebug((QDebug *)&local_80);
  }
  psVar1 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (top->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar1; psVar11 = psVar11 + 1
      ) {
    dump_header_class((psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      file,exportExpression);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"class ",6);
  if (exportExpression->_M_string_length != 0) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(exportExpression->_M_dataplus)._M_p,
                        exportExpression->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)file,(top->name)._M_dataplus._M_p,(top->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," : public QObject {",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tQ_OBJECT",9);
  cVar3 = (char)file;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  dumpQSettingsHeader();
  if ((dumpQSettingsHeader()::category[0x10] & 1) != 0) {
    dumpQSettingsHeader();
    local_78._M_dataplus._M_p._0_4_ = 2;
    local_78._M_dataplus._M_p._4_4_ = 0;
    local_78._M_string_length._0_4_ = 0;
    local_78._M_string_length._4_4_ = 0;
    local_78.field_2._M_allocated_capacity._0_4_ = 0;
    local_78.field_2._M_allocated_capacity._4_4_ = 0;
    local_78.field_2._8_8_ = dumpQSettingsHeader()::category._8_8_;
    QMessageLogger::debug();
    pQVar4 = local_80;
    QVar13.m_data = (storage_type *)0xa;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<(pQVar4,(QString *)&local_58);
    if ((QArrayData *)local_58._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58._M_dataplus._M_p = *(int *)local_58._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_58._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_58._M_dataplus._M_p,2,8);
      }
    }
    if (local_80[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_80,' ');
    }
    QTextStream::operator<<
              (local_80,(long)(top->properties).
                              super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(top->properties).
                              super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4);
    if (local_80[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_80,' ');
    }
    pQVar4 = local_80;
    QVar14.m_data = (storage_type *)0xb;
    QVar14.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<(pQVar4,(QString *)&local_58);
    if ((QArrayData *)local_58._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58._M_dataplus._M_p = *(int *)local_58._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_58._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_58._M_dataplus._M_p,2,8);
      }
    }
    if (local_80[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_80,' ');
    }
    QDebug::~QDebug((QDebug *)&local_80);
  }
  dump_header_q_properties(file,&top->properties);
  psVar11 = (top->subclasses).
            super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = top;
  if (psVar11 != psVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)file,"Q_PROPERTY(QObject* ",0x14);
      camel_case_to_underscore
                (&local_78,
                 &((psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,
                          (char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                           local_78._M_dataplus._M_p._0_4_),
                          CONCAT44(local_78._M_string_length._4_4_,
                                   (undefined4)local_78._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," MEMBER _",9);
      decapitalize(&local_58,
                   &((psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," CONSTANT)",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                        CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                                 local_78.field_2._M_allocated_capacity._0_4_) + 1);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"public:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  pMVar5 = local_38;
  if ((local_38->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tvoid sync();",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tvoid load();",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tstatic ",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar5->name)._M_dataplus._M_p,
                        (pMVar5->name)._M_string_length);
    pcVar10 = "* self();";
    lVar9 = 9;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\t",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar5->name)._M_dataplus._M_p,
                        (pMVar5->name)._M_string_length);
    pcVar10 = "(QObject *parent);";
    lVar9 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\t void loadDefaults();",0x16)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  psVar11 = (pMVar5->subclasses).
            super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (pMVar5->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\t",1);
      peVar2 = (psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(peVar2->name)._M_dataplus._M_p,
                          (peVar2->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," *",2);
      decapitalize(&local_78,
                   &((psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                                  local_78._M_dataplus._M_p._0_4_),
                          CONCAT44(local_78._M_string_length._4_4_,
                                   (undefined4)local_78._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() const;",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                        CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                                 local_78.field_2._M_allocated_capacity._0_4_) + 1);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  pMVar5 = local_38;
  dump_header_properties(file,&local_38->properties,true);
  pMVar6 = local_38;
  if ((pMVar5->subclasses).
      super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pMVar5->subclasses).
      super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    if ((local_38->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_38->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
      std::ostream::put(cVar3);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"private:",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    psVar11 = (pMVar6->subclasses).
              super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (pMVar6->subclasses).
             super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar11 != psVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\t",1);
        peVar2 = (psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)file,(peVar2->name)._M_dataplus._M_p,
                            (peVar2->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," *_",3);
        decapitalize(&local_78,
                     &((psVar11->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->name,0);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                                    local_78._M_dataplus._M_p._0_4_),
                            CONCAT44(local_78._M_string_length._4_4_,
                                     (undefined4)local_78._M_string_length));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                          CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                                   local_78.field_2._M_allocated_capacity._0_4_) + 1);
        }
        psVar11 = psVar11 + 1;
      } while (psVar11 != psVar1);
    }
  }
  pMVar5 = local_38;
  if ((local_38->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (((local_38->properties).
         super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (local_38->properties).
         super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((local_38->subclasses).
        super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_38->subclasses).
        super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
      std::ostream::put(cVar3);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"private:",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\t",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar5->name)._M_dataplus._M_p,
                        (pMVar5->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"();",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"};",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar3);
  std::ostream::put(cVar3);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  return;
}

Assistant:

void dump_header_class(
    MetaClass *top,
    std::ofstream &file,
    const std::string &exportExpression)
{

  qCDebug(dumpKConfigHeader) << "Dumping class header";
  for (auto &&child : top->subclasses) {
    dump_header_class(child.get(), file, exportExpression);
  }

  file << "class ";

  if (exportExpression.size() != 0) {
    file << exportExpression << " ";
  }

  file << top->name << " : public QObject {" << std::endl;
  file << "\tQ_OBJECT" << std::endl;

  // Q_PROPERTY declarations
  qCDebug(dumpKConfigHeader) << "Class has:" << top->properties.size()
                      << "properties.";
  dump_header_q_properties(file, top->properties);

  for (auto &&child : top->subclasses) {
    file << "Q_PROPERTY(QObject* " << camel_case_to_underscore(child->name)
         << " MEMBER _" << decapitalize(child->name, 0) << " CONSTANT)"
         << std::endl;
  }

  file << std::endl;
  file << "public:" << std::endl;
  if (top->parent) {
    file << "\t" << top->name << "(QObject *parent = 0);" << std::endl;
  } else {
    file << "\tvoid sync();" << std::endl;
    file << "\tvoid load();" << std::endl;
    file << "\tstatic " << top->name << "* self();" << std::endl;
  }

  file << "\t void loadDefaults();" << std::endl;

  for (auto &&child : top->subclasses) {
    file << "\t" << child->name << " *" << decapitalize(child->name, 0)
         << "() const;" << std::endl;
  }

  dump_header_properties(file, top->properties);
  dump_header_subclasses(file, top->subclasses, !top->properties.empty());

  if (!top->parent) {
    if (!top->properties.empty() || top->subclasses.empty()) {
      file << std::endl << "private:" << std::endl;
    }
    file << "\t" << top->name << "(QObject *parent = 0);" << std::endl;
  }
  file << "};" << std::endl << std::endl;
}